

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viff.cxx
# Opt level: O0

value_type_conflict8 __thiscall
vigra::colormap<unsigned_char,_unsigned_int>::operator()
          (colormap<unsigned_char,_unsigned_int> *this,domain_type index,uint band)

{
  value_type_conflict8 *pvVar1;
  undefined1 in_SIL;
  int *in_RDI;
  bool unaff_retaddr;
  uint stride;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined3 in_stack_ffffffffffffffec;
  int line;
  int *file;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  value_type_conflict8 vVar2;
  
  line = CONCAT13(in_SIL,in_stack_ffffffffffffffec);
  file = in_RDI;
  throw_precondition_error
            (unaff_retaddr,(char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
             (char *)in_RDI,line);
  if (in_RDI[1] == 1) {
    throw_precondition_error
              (unaff_retaddr,(char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (char *)file,line);
    pvVar1 = void_vector<unsigned_int>::operator[]
                       ((void_vector<unsigned_int> *)
                        CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        (size_type)in_RDI);
    vVar2 = *pvVar1;
  }
  else {
    throw_precondition_error
              (unaff_retaddr,(char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (char *)file,line);
    pvVar1 = void_vector<unsigned_int>::operator[]
                       ((void_vector<unsigned_int> *)
                        CONCAT44(in_RDI[2] * *in_RDI,in_stack_ffffffffffffffe0),(size_type)in_RDI);
    vVar2 = *pvVar1;
  }
  return vVar2;
}

Assistant:

value_type operator()( const domain_type index,
                               const unsigned int band = 0 ) const
        {
            vigra_precondition( index < m_numTableElements,
                                "index out of range" );
            if ( m_numTables == 1 ) {
                // map bands with a single (interleaved or not) table
                vigra_precondition( band < m_numTableBands,
                                    "band out of range" );
                return m_tables[ m_numTableElements * band + index ];
            } else {
                // map bands with multiple, non-interleaved tables
                vigra_precondition( band < m_numTables, "band out of range" );
                const unsigned int stride
                    = m_numTableBands * m_numTableElements;
                return m_tables[ stride * band + index ];
            }
        }